

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<int,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<int,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
          (BaseDictionary<int,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,int *key,Value **value)

{
  BaseDictionary<int,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  undefined8 *puVar2;
  hash_t hashCode;
  uint uVar3;
  long lVar4;
  code *pcVar5;
  char cVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  undefined4 *puVar10;
  long lVar11;
  uint depth;
  long lVar12;
  uint uVar13;
  
  lVar12 = *(long *)this;
  if (lVar12 == 0) {
    BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar12 = *(long *)this;
  }
  hashCode = *key * 2 + 1;
  uVar8 = BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar13 = *(uint *)(lVar12 + (ulong)uVar8 * 4);
  if ((int)uVar13 < 0) {
    cVar6 = (char)(uVar13 >> 0x18);
    depth = 0;
  }
  else {
    depth = 0;
    do {
      puVar2 = (undefined8 *)(*(long *)(this + 8) + (ulong)uVar13 * 0x10);
      if (*(int *)(*(long *)(this + 8) + 0xc + (ulong)uVar13 * 0x10) == *key) {
        if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
        }
        *puVar2 = *value;
        return uVar13;
      }
      depth = depth + 1;
      uVar13 = *(uint *)(puVar2 + 1);
    } while (-1 < (int)uVar13);
    cVar6 = (char)(uVar13 >> 0x18);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
  }
  if (cVar6 < '\0') {
    if (*(int *)(this + 0x28) == 0) {
      uVar13 = *(uint *)(this + 0x20);
      if (uVar13 == *(uint *)(this + 0x18)) {
        BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Resize((BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this);
        uVar8 = BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
        uVar13 = *(uint *)(this + 0x20);
      }
      *(uint *)(this + 0x20) = uVar13 + 1;
      if (*(int *)(this + 0x18) < (int)(uVar13 + 1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f1,"(count <= size)","count <= size");
        if (!bVar7) goto LAB_004801f9;
        *puVar10 = 0;
      }
      if (*(int *)(this + 0x18) <= (int)uVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f2,"(index < size)","index < size");
        if (!bVar7) goto LAB_004801f9;
        *puVar10 = 0;
      }
    }
    else {
      if (*(int *)(this + 0x28) < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d4,"(freeCount > 0)","freeCount > 0");
        if (!bVar7) goto LAB_004801f9;
        *puVar10 = 0;
      }
      if (*(int *)(this + 0x24) < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d5,"(freeList >= 0)","freeList >= 0");
        if (!bVar7) goto LAB_004801f9;
        *puVar10 = 0;
      }
      if (*(int *)(this + 0x20) <= *(int *)(this + 0x24)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d6,"(freeList < count)","freeList < count");
        if (!bVar7) {
LAB_004801f9:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar10 = 0;
      }
      uVar13 = *(uint *)(this + 0x24);
      pBVar1 = this + 0x28;
      *(int *)pBVar1 = *(int *)pBVar1 + -1;
      if (*(int *)pBVar1 != 0) {
        iVar9 = BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetNextFreeEntryIndex
                          ((EntryType *)((long)(int)uVar13 * 0x10 + *(long *)(this + 8)));
        *(int *)(this + 0x24) = iVar9;
      }
    }
    lVar12 = *(long *)(this + 8);
    lVar11 = (long)(int)uVar13 * 0x10;
    *(Value **)(lVar12 + lVar11) = *value;
    *(int *)(lVar12 + 0xc + lVar11) = *key;
    lVar4 = *(long *)this;
    *(undefined4 *)(lVar12 + 8 + lVar11) = *(undefined4 *)(lVar4 + (ulong)uVar8 * 4);
    *(uint *)(lVar4 + (ulong)uVar8 * 4) = uVar13;
    uVar8 = 0;
    uVar3 = uVar13;
    do {
      uVar3 = *(uint *)(lVar12 + 8 + (long)(int)uVar3 * 0x10);
      uVar8 = uVar8 + 1;
    } while (uVar3 != 0xffffffff);
    if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
      DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar8);
    }
  }
  return uVar13;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }